

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void post(uv__queue *q,uv__work_kind kind)

{
  uv__queue *puVar1;
  
  uv_mutex_lock(&mutex);
  puVar1 = q;
  if (kind == UV__WORK_SLOW_IO) {
    q->next = &slow_io_pending_wq;
    q->prev = slow_io_pending_wq.prev;
    (slow_io_pending_wq.prev)->next = q;
    puVar1 = &run_slow_work_message;
    slow_io_pending_wq.prev = q;
    if (run_slow_work_message.next != &run_slow_work_message) goto LAB_0016f5af;
  }
  puVar1->next = &wq;
  puVar1->prev = wq.prev;
  (wq.prev)->next = puVar1;
  wq.prev = puVar1;
  if (idle_threads != 0) {
    uv_cond_signal(&cond);
  }
LAB_0016f5af:
  uv_mutex_unlock(&mutex);
  return;
}

Assistant:

static void post(struct uv__queue* q, enum uv__work_kind kind) {
  uv_mutex_lock(&mutex);
  if (kind == UV__WORK_SLOW_IO) {
    /* Insert into a separate queue. */
    uv__queue_insert_tail(&slow_io_pending_wq, q);
    if (!uv__queue_empty(&run_slow_work_message)) {
      /* Running slow I/O tasks is already scheduled => Nothing to do here.
         The worker that runs said other task will schedule this one as well. */
      uv_mutex_unlock(&mutex);
      return;
    }
    q = &run_slow_work_message;
  }

  uv__queue_insert_tail(&wq, q);
  if (idle_threads > 0)
    uv_cond_signal(&cond);
  uv_mutex_unlock(&mutex);
}